

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O3

DecodeStatus DecodeINSVE_DF_4(MCInst *MI,uint32_t insn,uint64_t Address,MCRegisterInfo *Decoder)

{
  int iVar1;
  DecodeStatus DVar2;
  code *pcVar3;
  sbyte local_34;
  
  if ((insn & 0x300000) == 0) {
    pcVar3 = DecodeMSA128BRegisterClass;
    local_34 = 4;
  }
  else if ((insn & 0x380000) == 0x200000) {
    pcVar3 = DecodeMSA128HRegisterClass;
    local_34 = 3;
  }
  else if ((insn & 0x3c0000) == 0x300000) {
    pcVar3 = DecodeMSA128WRegisterClass;
    local_34 = 2;
  }
  else {
    if ((insn & 0x3e0000) != 0x380000) {
      return MCDisassembler_Fail;
    }
    pcVar3 = DecodeMSA128DRegisterClass;
    local_34 = 1;
  }
  iVar1 = (*pcVar3)();
  DVar2 = MCDisassembler_Fail;
  if (iVar1 != 0) {
    iVar1 = (*pcVar3)(MI,insn >> 6 & 0x1f,Address,Decoder);
    if (iVar1 == 0) {
      DVar2 = MCDisassembler_Fail;
    }
    else {
      MCOperand_CreateImm0(MI,(ulong)(insn >> 0x10 & ~(-1 << local_34)));
      iVar1 = (*pcVar3)(MI,insn >> 0xb & 0x1f,Address,Decoder);
      DVar2 = MCDisassembler_Fail;
      if (iVar1 != 0) {
        MCOperand_CreateImm0(MI,0);
        DVar2 = MCDisassembler_Success;
      }
    }
  }
  return DVar2;
}

Assistant:

static DecodeStatus DecodeINSVE_DF_4(MCInst *MI, uint32_t insn,
		uint64_t Address, const MCRegisterInfo *Decoder)
{
	typedef DecodeStatus (*DecodeFN)(MCInst *, unsigned, uint64_t, const MCRegisterInfo *);
	// The size of the n field depends on the element size
	// The register class also depends on this.
	uint32_t tmp = fieldFromInstruction(insn, 17, 5);
	unsigned NSize = 0;
	DecodeFN RegDecoder = NULL;

	if ((tmp & 0x18) == 0x00) { // INSVE_B
		NSize = 4;
		RegDecoder = DecodeMSA128BRegisterClass;
	} else if ((tmp & 0x1c) == 0x10) { // INSVE_H
		NSize = 3;
		RegDecoder = DecodeMSA128HRegisterClass;
	} else if ((tmp & 0x1e) == 0x18) { // INSVE_W
		NSize = 2;
		RegDecoder = DecodeMSA128WRegisterClass;
	} else if ((tmp & 0x1f) == 0x1c) { // INSVE_D
		NSize = 1;
		RegDecoder = DecodeMSA128DRegisterClass;
	} //else llvm_unreachable("Invalid encoding");

	//assert(NSize != 0 && RegDecoder != nullptr);
	if (NSize == 0 || RegDecoder == NULL)
		return MCDisassembler_Fail;

	// $wd
	tmp = fieldFromInstruction(insn, 6, 5);
	if (RegDecoder(MI, tmp, Address, Decoder) == MCDisassembler_Fail)
		return MCDisassembler_Fail;

	// $wd_in
	if (RegDecoder(MI, tmp, Address, Decoder) == MCDisassembler_Fail)
		return MCDisassembler_Fail;

	// $n
	tmp = fieldFromInstruction(insn, 16, NSize);
	MCOperand_CreateImm0(MI, tmp);

	// $ws
	tmp = fieldFromInstruction(insn, 11, 5);
	if (RegDecoder(MI, tmp, Address, Decoder) == MCDisassembler_Fail)
		return MCDisassembler_Fail;

	// $n2
	MCOperand_CreateImm0(MI, 0);

	return MCDisassembler_Success;
}